

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Client::Client(Client *this,bool init)

{
  anon_class_1_0_00000001 local_12;
  byte local_11;
  Client *pCStack_10;
  bool init_local;
  Client *this_local;
  
  this->_vptr_Client = (_func_int **)&PTR__Client_00137af0;
  local_11 = init;
  pCStack_10 = this;
  std::make_unique<restincurl::Worker>();
  if ((local_11 & 1) != 0) {
    std::call_once<restincurl::Client::Client(bool)::_lambda()_1_>(&Client::flag,&local_12);
  }
  return;
}

Assistant:

Client(const bool init = true) {
            if (init) {
                static std::once_flag flag;
                std::call_once(flag, [] {
                    RESTINCURL_LOG("One time initialization of curl.");
                    curl_global_init(CURL_GLOBAL_DEFAULT);
                });
            }
        }